

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcSlab::~IfcSlab(IfcSlab *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)this = 0x88bb60;
  *(undefined8 *)&this->field_0x180 = 0x88bc78;
  *(undefined8 *)&this->field_0x88 = 0x88bb88;
  *(undefined8 *)&this->field_0x98 = 0x88bbb0;
  *(undefined8 *)&this->field_0xd0 = 0x88bbd8;
  *(undefined8 *)&this->field_0x100 = 0x88bc00;
  *(undefined8 *)&this->field_0x138 = 0x88bc28;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x88bc50;
  puVar2 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>).field_0x10;
  puVar1 = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>).field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)this,&PTR_construction_vtable_24__0088bc98);
  return;
}

Assistant:

IfcSlab() : Object("IfcSlab") {}